

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_pippenger_bucket_window(size_t n)

{
  size_t n_local;
  undefined4 local_4;
  
  if (n < 2) {
    local_4 = 1;
  }
  else if (n < 5) {
    local_4 = 2;
  }
  else if (n < 0x15) {
    local_4 = 3;
  }
  else if (n < 0x3a) {
    local_4 = 4;
  }
  else if (n < 0x89) {
    local_4 = 5;
  }
  else if (n < 0xec) {
    local_4 = 6;
  }
  else if (n < 0x4ed) {
    local_4 = 7;
  }
  else if (n < 0x1145) {
    local_4 = 9;
  }
  else if (n < 0x1ec9) {
    local_4 = 10;
  }
  else if (n < 0x3eb3) {
    local_4 = 0xb;
  }
  else {
    local_4 = 0xc;
  }
  return local_4;
}

Assistant:

static int secp256k1_pippenger_bucket_window(size_t n) {
    if (n <= 1) {
        return 1;
    } else if (n <= 4) {
        return 2;
    } else if (n <= 20) {
        return 3;
    } else if (n <= 57) {
        return 4;
    } else if (n <= 136) {
        return 5;
    } else if (n <= 235) {
        return 6;
    } else if (n <= 1260) {
        return 7;
    } else if (n <= 4420) {
        return 9;
    } else if (n <= 7880) {
        return 10;
    } else if (n <= 16050) {
        return 11;
    } else {
        return PIPPENGER_MAX_BUCKET_WINDOW;
    }
}